

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

PromiseFulfillerPair<capnp::AnyPointer::Pipeline> *
kj::newPromiseAndFulfiller<capnp::AnyPointer::Pipeline>(void)

{
  AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>
  *pAVar1;
  PromiseFulfillerPair<capnp::AnyPointer::Pipeline> *in_RDI;
  Own<kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>_> wrapper;
  Own<kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>_> local_48;
  Own<kj::_::PromiseNode> local_38;
  Own<kj::_::AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>_>
  local_28;
  
  _::WeakFulfiller<capnp::AnyPointer::Pipeline>::make();
  heap<kj::_::AdapterPromiseNode<capnp::AnyPointer::Pipeline,kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>>,kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>&>
            ((kj *)&local_28,local_48.ptr);
  pAVar1 = local_28.ptr;
  local_38.disposer = local_28.disposer;
  local_28.ptr = (AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>
                  *)0x0;
  Own<kj::_::AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>_>
  ::dispose(&local_28);
  local_38.ptr = (PromiseNode *)0x0;
  (in_RDI->promise).super_PromiseBase.node.disposer = local_28.disposer;
  (in_RDI->promise).super_PromiseBase.node.ptr = (PromiseNode *)pAVar1;
  local_28.ptr = (AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>
                  *)0x0;
  (in_RDI->fulfiller).disposer = local_48.disposer;
  (in_RDI->fulfiller).ptr = &(local_48.ptr)->super_PromiseFulfiller<capnp::AnyPointer::Pipeline>;
  local_48.ptr = (WeakFulfiller<capnp::AnyPointer::Pipeline> *)0x0;
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_28);
  Own<kj::_::PromiseNode>::dispose(&local_38);
  Own<kj::_::WeakFulfiller<capnp::AnyPointer::Pipeline>_>::dispose(&local_48);
  return in_RDI;
}

Assistant:

PromiseFulfillerPair<T> newPromiseAndFulfiller() {
  auto wrapper = _::WeakFulfiller<T>::make();

  Own<_::PromiseNode> intermediate(
      heap<_::AdapterPromiseNode<_::FixVoid<T>, _::PromiseAndFulfillerAdapter<T>>>(*wrapper));
  _::ReducePromises<T> promise(false,
      _::maybeChain(kj::mv(intermediate), implicitCast<T*>(nullptr)));

  return PromiseFulfillerPair<T> { kj::mv(promise), kj::mv(wrapper) };
}